

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O0

void __thiscall oqpi::posix_thread::~posix_thread(posix_thread *this)

{
  bool bVar1;
  posix_thread *this_local;
  
  if ((this->handle_ != 0) &&
     (bVar1 = assert_and_return_true
                        ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/threading/posix_thread.hpp"
                         ,0x2f,"handle_ == 0",""), bVar1)) {
    this->handle_ = 0;
  }
  return;
}

Assistant:

~posix_thread()
        {
            // The interface should have taken care of either joining or terminating the thread
            if (oqpi_failed(handle_ == 0))
            {
                handle_ = 0;
            }
        }